

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_cat(char *args)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  char buffer [128];
  char local_98 [128];
  
  pcVar6 = args;
  if (*args == '\"') {
    pcVar6 = args + 1;
    sVar2 = strlen(pcVar6);
    args[sVar2] = '\0';
  }
  lVar3 = PHYSFS_openRead(pcVar6);
  if (lVar3 == 0) {
    uVar5 = PHYSFS_getLastError();
    printf("failed to open. Reason: [%s].\n",uVar5);
    return 1;
  }
  if ((do_buffer_size == 0) || (iVar1 = PHYSFS_setBuffer(lVar3), iVar1 != 0)) {
    do {
      uVar4 = PHYSFS_readBytes(lVar3,local_98,0x80);
      if (0 < (long)uVar4) {
        uVar7 = 0;
        do {
          fputc((int)local_98[uVar7],_stdout);
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
    } while (0x7f < uVar4);
    puts("\n");
    iVar1 = PHYSFS_eof(lVar3);
    if (iVar1 != 0) goto LAB_0010439f;
    uVar5 = PHYSFS_getLastError();
    pcVar6 = "\n (Error condition in reading. Reason: [%s])\n\n";
  }
  else {
    uVar5 = PHYSFS_getLastError();
    pcVar6 = "failed to set file buffer. Reason: [%s].\n";
  }
  printf(pcVar6,uVar5);
LAB_0010439f:
  PHYSFS_close(lVar3);
  return 1;
}

Assistant:

static int cmd_cat(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f, do_buffer_size))
            {
                printf("failed to set file buffer. Reason: [%s].\n",
                        PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */
        } /* if */

        while (1)
        {
            char buffer[128];
            PHYSFS_sint64 rc;
            PHYSFS_sint64 i;
            rc = PHYSFS_readBytes(f, buffer, sizeof (buffer));

            for (i = 0; i < rc; i++)
                fputc((int) buffer[i], stdout);

            if (rc < sizeof (buffer))
            {
                printf("\n\n");
                if (!PHYSFS_eof(f))
                {
                    printf("\n (Error condition in reading. Reason: [%s])\n\n",
                           PHYSFS_getLastError());
                } /* if */
                PHYSFS_close(f);
                return 1;
            } /* if */
        } /* while */
    } /* else */

    return 1;
}